

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_d_generator.cc
# Opt level: O1

string * __thiscall
t_d_generator::render_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_d_generator *this,t_type *ttype,bool isArg)

{
  undefined1 *puVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  long *plVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  t_type *ptVar6;
  t_type *ptVar7;
  size_type *psVar8;
  char *pcVar9;
  pointer pcVar10;
  char *pcVar11;
  _func_int **pp_Var12;
  t_list *tlist;
  t_base_type *this_00;
  undefined1 auVar13 [12];
  string local_70;
  string local_50;
  
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[5])(ttype);
  if ((char)iVar4 != '\0') {
    this_00 = (t_base_type *)(ulong)*(uint *)&ttype[1].super_t_doc._vptr_t_doc;
    switch(this_00) {
    case (t_base_type *)0x0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "void";
      pcVar9 = "";
      break;
    case (t_base_type *)0x1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "string";
      pcVar9 = "";
      break;
    case (t_base_type *)0x2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "bool";
      pcVar9 = "";
      break;
    case (t_base_type *)0x3:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "byte";
      pcVar9 = "";
      break;
    case (t_base_type *)0x4:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "short";
      pcVar9 = "";
      break;
    case (t_base_type *)0x5:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "int";
      pcVar9 = "";
      break;
    case (t_base_type *)0x6:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "long";
      pcVar9 = "";
      break;
    case (t_base_type *)0x7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar11 = "double";
      pcVar9 = "";
      break;
    default:
      auVar13 = __cxa_allocate_exception(0x20);
      t_base_type::t_base_name_abi_cxx11_(&local_70,this_00,auVar13._8_4_);
      std::operator+(auVar13._0_8_,"Compiler error: No D type name for base type ",&local_70);
      __cxa_throw(auVar13._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar11,pcVar9)
    ;
    return __return_storage_ptr__;
  }
  iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xd])(ttype);
  if ((char)iVar4 == '\0') {
LAB_001af023:
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xb])(ttype);
    if (((byte)iVar4 & isArg) != 1) {
      iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pp_Var12 = *(_func_int ***)CONCAT44(extraout_var_00,iVar4);
      pcVar10 = (pointer)((undefined8 *)CONCAT44(extraout_var_00,iVar4))[1];
LAB_001af09e:
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pp_Var12,pcVar10 + (long)pp_Var12);
      return __return_storage_ptr__;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(&local_70,"ref const(",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar4));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      lVar2 = plVar5[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
  }
  else {
    if (ttype[1].super_t_doc.doc_.field_2._M_local_buf[8] == '\x01') {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pp_Var12 = ttype[1].super_t_doc._vptr_t_doc;
      pcVar10 = ttype[1].super_t_doc.doc_._M_dataplus._M_p;
      goto LAB_001af09e;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
    if ((char)iVar4 != '\0') {
      ptVar7 = *(t_type **)&ttype[1].super_t_doc.has_doc_;
      render_type_name_abi_cxx11_
                (&local_70,this,*(t_type **)&ttype[1].annotations_._M_t._M_impl,false);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ptVar6 = t_type::get_true_type(ptVar7);
      iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[5])(ptVar6);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[10])(ptVar6), (char)iVar4 == '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      render_type_name_abi_cxx11_(&local_70,this,ptVar7,false);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      ptVar7 = t_type::get_true_type(ptVar7);
      iVar4 = (*(ptVar7->super_t_doc)._vptr_t_doc[5])(ptVar7);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ptVar7->super_t_doc)._vptr_t_doc[10])(ptVar7), (char)iVar4 == '\0')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar4 != '\0') {
      render_type_name_abi_cxx11_(&local_50,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x383983);
      psVar8 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_70.field_2._M_allocated_capacity = *psVar8;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar8;
        local_70._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar8) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      psVar3 = &local_50;
      goto LAB_001af0d0;
    }
    iVar4 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar4 == '\0') goto LAB_001af023;
    render_type_name_abi_cxx11_(&local_70,this,*(t_type **)&ttype[1].super_t_doc.has_doc_,false);
    std::operator+(__return_storage_ptr__,&local_70,"[]");
  }
  psVar3 = &local_70;
LAB_001af0d0:
  puVar1 = (undefined1 *)(&(psVar3->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 == &psVar3->field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(puVar1);
  return __return_storage_ptr__;
}

Assistant:

string render_type_name(const t_type* ttype, bool isArg = false) const {
    if (ttype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        return "void";
      case t_base_type::TYPE_STRING:
        return "string";
      case t_base_type::TYPE_BOOL:
        return "bool";
      case t_base_type::TYPE_I8:
        return "byte";
      case t_base_type::TYPE_I16:
        return "short";
      case t_base_type::TYPE_I32:
        return "int";
      case t_base_type::TYPE_I64:
        return "long";
      case t_base_type::TYPE_DOUBLE:
        return "double";
      default:
        throw "Compiler error: No D type name for base type " + t_base_type::t_base_name(tbase);
      }
    }

    if (ttype->is_container()) {
      t_container* tcontainer = (t_container*)ttype;
      if (tcontainer->has_cpp_name()) {
        return tcontainer->get_cpp_name();
      } else if (ttype->is_map()) {
        t_map* tmap = (t_map*)ttype;
        t_type* ktype = tmap->get_key_type();

        string name = render_type_name(tmap->get_val_type()) + "[";
        if (!is_immutable_type(ktype)) {
          name += "immutable(";
        }
        name += render_type_name(ktype);
        if (!is_immutable_type(ktype)) {
          name += ")";
        }
        name += "]";
        return name;
      } else if (ttype->is_set()) {
        t_set* tset = (t_set*)ttype;
        return "HashSet!(" + render_type_name(tset->get_elem_type()) + ")";
      } else if (ttype->is_list()) {
        t_list* tlist = (t_list*)ttype;
        return render_type_name(tlist->get_elem_type()) + "[]";
      }
    }

    if (ttype->is_struct() && isArg) {
      return "ref const(" + ttype->get_name() + ")";
    } else {
      return ttype->get_name();
    }
  }